

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_write.cpp
# Opt level: O0

ssize_t __thiscall
ritobin::io::impl_binary_write::BinaryWriter::write
          (BinaryWriter *this,int __fd,void *__buf,size_t __n)

{
  ulong uVar1;
  ulong extraout_RAX;
  bool bVar2;
  uchar local_1a;
  undefined1 local_19;
  uint8_t raw;
  BinaryWriter *pBStack_18;
  Type type_local;
  BinaryWriter *this_local;
  
  local_19 = (undefined1)__fd;
  local_1a = '\0';
  pBStack_18 = this;
  uVar1 = (**(code **)(*(long *)this->compat_ + 8))(this->compat_,local_19,&local_1a,local_19);
  bVar2 = (uVar1 & 1) != 0;
  if (bVar2) {
    write<unsigned_char>(this,local_1a);
    uVar1 = extraout_RAX;
  }
  return CONCAT71((int7)(uVar1 >> 8),bVar2);
}

Assistant:

[[nodiscard]] bool write(Type type) noexcept {
            uint8_t raw = 0;
            if (compat_->type_to_raw(type, raw)) {
                write(raw);
                return true;
            } else {
                return false;
            }
        }